

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qft.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int nbQubits;
  int iVar1;
  ostream *poVar2;
  QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> circuit;
  string local_1c8 [32];
  stringstream qasm;
  unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> local_1a0;
  ostream local_198 [376];
  
  iVar1 = 5;
  if (argc < 2) {
    nbQubits = 2;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&qasm,argv[1],(allocator<char> *)&circuit);
    nbQubits = std::__cxx11::stoi((string *)&qasm,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&qasm);
    if (argc != 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&qasm,argv[2],(allocator<char> *)&circuit);
      iVar1 = std::__cxx11::stoi((string *)&qasm,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&qasm);
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"nb qubits = ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,nbQubits);
  std::endl<char,std::char_traits<char>>(poVar2);
  qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::QCircuit
            (&circuit,nbQubits);
  qft<std::complex<double>>(&circuit);
  if (nbQubits <= iVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"\nmatrix =");
    std::endl<char,std::char_traits<char>>(poVar2);
    qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::matrix
              ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)&qasm);
    qclab::printMatrix<qclab::dense::SquareMatrix<std::complex<double>>>
              ((SquareMatrix<std::complex<double>_> *)&qasm);
    std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
    ~unique_ptr(&local_1a0);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&qasm);
  qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::toQASM
            (&circuit,local_198,0);
  poVar2 = std::operator<<((ostream *)&std::cout,"\nqasm:\n");
  std::__cxx11::stringbuf::str();
  std::operator<<(poVar2,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&qasm);
  qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::~QCircuit(&circuit)
  ;
  return 0;
}

Assistant:

int main( int argc , char *argv[] ) {

  using T = std::complex< double > ;

  // defaults
  int nbQubits = 2 ;
  int maxPrint = 5 ;

  // arguments
  if ( argc > 1 ) nbQubits = std::stoi( argv[1] ) ;
  if ( argc > 2 ) maxPrint = std::stoi( argv[2] ) ;
  std::cout << "nb qubits = " << nbQubits << std::endl ;

  // quantum circuit
  qclab::QCircuit< T > circuit( nbQubits ) ;

  // qft
  qft( circuit ) ;

  // print matrix
  if ( nbQubits <= maxPrint ) {
    std::cout << "\nmatrix =" << std::endl ;
    qclab::printMatrix( circuit.matrix() ) ;
  }

  // print qasm
  std::stringstream qasm ;
  circuit.toQASM( qasm ) ;
  std::cout << "\nqasm:\n" << qasm.str() ;

  // successful
  return 0 ;

}